

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O0

void Sbd_ManSolverPrint(Vec_Int_t *vSop)

{
  int iVar1;
  int iVar2;
  char local_178 [8];
  char Cube [65];
  word Supp;
  int pInds [64];
  int local_20;
  int local_1c;
  int nVars;
  int Entry;
  int i;
  int v;
  Vec_Int_t *vSop_local;
  
  _i = vSop;
  register0x00000000 = Sbd_ManSolverSupp(vSop,(int *)&Supp,&local_20);
  memset(local_178,0,0x41);
  if (local_178[local_20] == '\0') {
    for (Entry = 0; Entry < local_20; Entry = Entry + 1) {
      local_178[Entry] = '-';
    }
    for (nVars = 0; iVar2 = nVars, iVar1 = Vec_IntSize(_i), iVar2 < iVar1; nVars = nVars + 1) {
      local_1c = Vec_IntEntry(_i,nVars);
      if (local_1c == -1) {
        printf("%s\n",local_178);
        for (Entry = 0; Entry < local_20; Entry = Entry + 1) {
          local_178[Entry] = '-';
        }
      }
      else {
        iVar2 = Abc_LitIsCompl(local_1c);
        iVar1 = Abc_Lit2Var(local_1c);
        local_178[pInds[(long)iVar1 + -2]] = '1' - (char)iVar2;
      }
    }
    return;
  }
  __assert_fail("Cube[nVars] == \'\\0\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                ,0x15d,"void Sbd_ManSolverPrint(Vec_Int_t *)");
}

Assistant:

void Sbd_ManSolverPrint( Vec_Int_t * vSop )
{
    int v, i, Entry, nVars, pInds[64];
    word Supp = Sbd_ManSolverSupp( vSop, pInds, &nVars );
    char Cube[65] = {'\0'};
    assert( Cube[nVars] == '\0' );
    for ( v = 0; v < nVars; v++ )
        Cube[v] = '-';
    Vec_IntForEachEntry( vSop, Entry, i )
    {
        if ( Entry == -1 )
        {
            printf( "%s\n", Cube );
            for ( v = 0; v < nVars; v++ )
                Cube[v] = '-';
            continue;
        }
        Cube[pInds[Abc_Lit2Var(Entry)]] = '1' - (char)Abc_LitIsCompl(Entry);
    }
    Supp = 0;
}